

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmselect.c
# Opt level: O1

void wake_server_thread(select_data_ptr sd)

{
  ssize_t sVar1;
  
  if (sd->wake_write_fd != -1) {
    sVar1 = write(sd->wake_write_fd,&wake_server_thread::buffer,1);
    if (sVar1 != 1) {
      puts("Whoops, wake write failed");
      return;
    }
  }
  return;
}

Assistant:

static void
wake_server_thread(select_data_ptr sd)
{
    static char buffer = 'W';  /* doesn't matter what we write */
    if (sd->wake_write_fd != -1) {
#ifdef HAVE_WINDOWS_H
	send(sd->wake_write_fd, &buffer, 1, 0);
#else
	if (write(sd->wake_write_fd, &buffer, 1) != 1) {
	    printf("Whoops, wake write failed\n");
	}
#endif
    }
}